

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_init_cdef_worker(AV1_COMP *cpi)

{
  long lVar1;
  long *in_RDI;
  int num_cdef_workers;
  PrimaryMultiThreadInfo *p_mt_info;
  int in_stack_00000078;
  int in_stack_0000007c;
  AV1CdefSync *in_stack_00000080;
  AV1CdefWorkerData **in_stack_00000088;
  AV1_COMMON *in_stack_00000090;
  
  if (*(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4) < 1) {
    lVar1 = *in_RDI;
    av1_get_num_mod_workers_for_alloc((PrimaryMultiThreadInfo *)(lVar1 + 0x123d0),MOD_CDEF);
    av1_alloc_cdef_buffers
              (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_0000007c,
               in_stack_00000078);
    in_RDI[0x13a36] = *(long *)(lVar1 + 0x12418);
  }
  return;
}

Assistant:

void av1_init_cdef_worker(AV1_COMP *cpi) {
  // The allocation is done only for level 0 parallel frames. No change
  // in config is supported in the middle of a parallel encode set, since the
  // rest of the MT modules also do not support dynamic change of config.
  if (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) return;
  PrimaryMultiThreadInfo *const p_mt_info = &cpi->ppi->p_mt_info;
  int num_cdef_workers = av1_get_num_mod_workers_for_alloc(p_mt_info, MOD_CDEF);

  av1_alloc_cdef_buffers(&cpi->common, &p_mt_info->cdef_worker,
                         &cpi->mt_info.cdef_sync, num_cdef_workers, 1);
  cpi->mt_info.cdef_worker = p_mt_info->cdef_worker;
}